

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O2

Reduction * add_Reduction(Parser *p,ZNode *z,SNode *sn,D_Reduction *reduction)

{
  char *pcVar1;
  char *pcVar2;
  uint uVar3;
  uint uVar4;
  Reduction *pRVar5;
  Reduction **ppRVar6;
  
  ppRVar6 = &p->reductions_todo;
  uVar3 = znode_depth(z);
  do {
    pRVar5 = *ppRVar6;
    if (pRVar5 == (Reduction *)0x0) {
LAB_00143c24:
      pRVar5 = p->free_reductions;
      if (pRVar5 == (Reduction *)0x0) {
        pRVar5 = (Reduction *)malloc(0x30);
      }
      else {
        p->free_reductions = pRVar5->next;
      }
      pRVar5->znode = z;
      pRVar5->snode = sn;
      pRVar5->new_snode = (SNode *)0x0;
      sn->refcount = sn->refcount + 1;
      pRVar5->reduction = reduction;
      pRVar5->next = *ppRVar6;
      *ppRVar6 = pRVar5;
      return pRVar5;
    }
    pcVar1 = (sn->loc).s;
    pcVar2 = (pRVar5->snode->loc).s;
    if (pcVar1 < pcVar2) goto LAB_00143c24;
    uVar4 = znode_depth(pRVar5->znode);
    if (uVar4 <= uVar3 && pcVar1 == pcVar2) {
      if (uVar3 == uVar4) {
        do {
          if (((pRVar5->snode == sn) && (pRVar5->znode == z)) && (pRVar5->reduction == reduction)) {
            return (Reduction *)0x0;
          }
          pRVar5 = pRVar5->next;
        } while (pRVar5 != (Reduction *)0x0);
      }
      goto LAB_00143c24;
    }
    ppRVar6 = &pRVar5->next;
  } while( true );
}

Assistant:

static Reduction *add_Reduction(Parser *p, ZNode *z, SNode *sn, D_Reduction *reduction) {
  Reduction *x, **l = &p->reductions_todo;
  uint d = znode_depth(z), dd;
  for (x = p->reductions_todo; x; l = &x->next, x = x->next) {
    if (sn->loc.s < x->snode->loc.s) break;
    dd = znode_depth(x->znode);
    if ((sn->loc.s == x->snode->loc.s && d >= dd)) {
      if (d == dd)
        while (x) {
          if (sn == x->snode && z == x->znode && reduction == x->reduction) return NULL;
          x = x->next;
        }
      break;
    }
  }
  {
    Reduction *r = p->free_reductions;
    if (!r)
      r = MALLOC(sizeof *r);
    else
      p->free_reductions = r->next;
    r->znode = z;
    r->snode = sn;
    r->new_snode = NULL;
    ref_sn(sn);
    r->reduction = reduction;
    r->next = *l;
    *l = r;
    return r;
  }
}